

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cc
# Opt level: O2

void __thiscall iqxmlrpc::Server_feedback::set_exit_flag(Server_feedback *this)

{
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (this->server_ != (Server *)0x0) {
    Server::set_exit_flag(this->server_);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Server_feedback: null pointer access.",&local_39);
  Exception::Exception(this_00,&local_38,-32000);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server_feedback::set_exit_flag()
{
  if (!server_) // should never be
    throw Exception("Server_feedback: null pointer access.");

  server_->set_exit_flag();
}